

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filename_list.cxx
# Opt level: O0

int fl_filename_list(char *d,dirent ***list,Fl_File_Sort_F *sort)

{
  dirent *__src;
  uint uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  size_t sVar5;
  char *pcVar6;
  char *pcVar7;
  dirent *__dest;
  char *dst;
  dirent *newde;
  int len;
  dirent *de;
  char *pcStack_48;
  int newlen;
  char *name;
  char *fullname;
  int i;
  int n;
  char *dirloc;
  int dirlen;
  Fl_File_Sort_F *sort_local;
  dirent ***list_local;
  char *d_local;
  
  sVar5 = strlen(d);
  uVar1 = (uint)sVar5;
  pcVar6 = (char *)malloc((long)(int)(uVar1 + 1));
  fl_utf8to_mb(d,uVar1,pcVar6,uVar1 + 1);
  iVar2 = scandir64(pcVar6,(dirent64 ***)list,(__selector *)0x0,(__cmp *)sort);
  free(pcVar6);
  pcVar6 = (char *)malloc((long)(int)(uVar1 + 0x803));
  memcpy(pcVar6,d,(long)(int)(uVar1 + 1));
  pcVar7 = pcVar6 + (int)uVar1;
  pcStack_48 = pcVar7;
  if ((pcVar7 != pcVar6) && (pcVar7[-1] != '/')) {
    pcStack_48 = pcVar7 + 1;
    *pcVar7 = '/';
  }
  for (fullname._0_4_ = 0; (int)fullname < iVar2; fullname._0_4_ = (int)fullname + 1) {
    __src = (*list)[(int)fullname];
    sVar5 = strlen(__src->d_name);
    uVar1 = (uint)sVar5;
    uVar3 = fl_utf8from_mb((char *)0x0,0,__src->d_name,uVar1);
    __dest = (dirent *)malloc((long)(int)uVar3 + 0x15);
    memcpy(__dest,__src,0x13);
    fl_utf8from_mb(__dest->d_name,uVar3 + 1,__src->d_name,uVar1);
    if ((__src->d_name[(int)(uVar1 - 1)] != '/') && ((int)uVar1 < 0x801)) {
      memcpy(pcStack_48,__src->d_name,(long)(int)(uVar1 + 1));
      iVar4 = fl_filename_isdir(pcVar6);
      if (iVar4 != 0) {
        __dest->d_name[(int)uVar3] = '/';
        (__dest->d_name + (int)uVar3)[1] = '\0';
      }
    }
    free(__src);
    (*list)[(int)fullname] = __dest;
  }
  free(pcVar6);
  return iVar2;
}

Assistant:

int fl_filename_list(const char *d, dirent ***list,
                     Fl_File_Sort_F *sort) {
#if defined(WIN32) && !defined(__CYGWIN__) && !defined(HAVE_SCANDIR)
  // For Windows we have a special scandir implementation that uses
  // the Win32 "wide" functions for lookup, avoiding the code page mess
  // entirely. It also fixes up the trailing '/'.
  return fl_scandir(d, list, 0, sort);

#else // WIN32

  int dirlen;
  char *dirloc;

  // Assume that locale encoding is no less dense than UTF-8
  dirlen = strlen(d);
#ifdef __APPLE__
  dirloc = (char *)d;
#else
  dirloc = (char *)malloc(dirlen + 1);
  fl_utf8to_mb(d, dirlen, dirloc, dirlen + 1);
#endif

#ifndef HAVE_SCANDIR
  // This version is when we define our own scandir
  int n = fl_scandir(dirloc, list, 0, sort);
#elif defined(HAVE_SCANDIR_POSIX) && !defined(__APPLE__)
  // POSIX (2008) defines the comparison function like this:
  int n = scandir(dirloc, list, 0, (int(*)(const dirent **, const dirent **))sort);
#elif defined(__osf__)
  // OSF, DU 4.0x
  int n = scandir(dirloc, list, 0, (int(*)(dirent **, dirent **))sort);
#elif defined(_AIX)
  // AIX is almost standard...
  int n = scandir(dirloc, list, 0, (int(*)(void*, void*))sort);
#elif defined(__sgi)
  int n = scandir(dirloc, list, 0, sort);
#elif defined(__APPLE__)
# if MAC_OS_X_VERSION_MAX_ALLOWED >= MAC_OS_X_VERSION_10_8
  int n = scandir(dirloc, list, 0, (int(*)(const struct dirent**,const struct dirent**))sort);
# else
  int n = scandir(dirloc, list, 0, (int(*)(const void*,const void*))sort);
# endif
#else
  // The vast majority of UNIX systems want the sort function to have this
  // prototype, most likely so that it can be passed to qsort without any
  // changes:
  int n = scandir(dirloc, list, 0, (int(*)(const void*,const void*))sort);
#endif

#ifndef __APPLE__
  free(dirloc);
#endif

  // convert every filename to utf-8, and append a '/' to all
  // filenames that are directories
  int i;
  char *fullname = (char*)malloc(dirlen+FL_PATH_MAX+3); // Add enough extra for two /'s and a nul
  // Use memcpy for speed since we already know the length of the string...
  memcpy(fullname, d, dirlen+1);

  char *name = fullname + dirlen;
  if (name!=fullname && name[-1]!='/')
    *name++ = '/';

  for (i=0; i<n; i++) {
    int newlen;
    dirent *de = (*list)[i];
    int len = strlen(de->d_name);
#ifdef __APPLE__
    newlen = len;
#else
    newlen = fl_utf8from_mb(NULL, 0, de->d_name, len);
#endif
    dirent *newde = (dirent*)malloc(de->d_name - (char*)de + newlen + 2); // Add space for a / and a nul

    // Conversion to UTF-8
    memcpy(newde, de, de->d_name - (char*)de);
#ifdef __APPLE__
    strcpy(newde->d_name, de->d_name);
#else
    fl_utf8from_mb(newde->d_name, newlen + 1, de->d_name, len);
#endif

    // Check if dir (checks done on "old" name as we need to interact with
    // the underlying OS)
    if (de->d_name[len-1]!='/' && len<=FL_PATH_MAX) {
      // Use memcpy for speed since we already know the length of the string...
      memcpy(name, de->d_name, len+1);
      if (fl_filename_isdir(fullname)) {
        char *dst = newde->d_name + newlen;
        *dst++ = '/';
        *dst = 0;
      }
    }

    free(de);
    (*list)[i] = newde;
  }
  free(fullname);

  return n;

#endif // WIN32
}